

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O1

void api_suite::api_remove_back(void)

{
  size_type local_68;
  undefined4 local_5c;
  type local_58 [4];
  circular_view<int,_4UL> local_48;
  
  local_48.member.data = local_58;
  local_48.member.next = 5;
  local_48.member.size = 1;
  local_58[0] = 0xb;
  local_68 = 1;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x11b,"void api_suite::api_remove_back()",&local_68,&local_5c);
  vista::circular_view<int,_4UL>::remove_back(&local_48,1);
  local_68 = local_48.member.size;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x11d,"void api_suite::api_remove_back()",&local_68,&local_5c);
  return;
}

Assistant:

void api_remove_back()
{
    circular_array<int, 4> data;
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 1);
    data.remove_back();
    BOOST_TEST_EQ(data.size(), 0);
}